

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O3

int Abc_NtkMfsTryResubOnce(Mfs_Man_t *p,int *pCands,int nCands)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Ptr_t *pVVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  p->nSatCalls = p->nSatCalls + 1;
  iVar7 = sat_solver_solve(p->pSat,pCands,pCands + nCands,(long)p->pPars->nBTLimit,0,0,0);
  if (iVar7 == -1) {
    iVar7 = 1;
  }
  else {
    if (iVar7 == 1) {
      p->nSatCexes = p->nSatCexes + 1;
      pVVar3 = p->vProjVarsSat;
      iVar7 = pVVar3->nSize;
      lVar8 = 0x6c;
      if (0 < iVar7) {
        piVar4 = pVVar3->pArray;
        pVVar5 = p->vDivCexes;
        lVar9 = 0;
        do {
          if (pVVar5->nSize <= lVar9) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          uVar1 = piVar4[lVar9];
          if (((int)uVar1 < 0) || (p->pSat->size <= (int)uVar1)) {
            __assert_fail("v >= 0 && v < s->size",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                          ,0xda,"int sat_solver_var_value(sat_solver *, int)");
          }
          if (p->pSat->model[uVar1] != 1) {
            pvVar6 = pVVar5->pArray[lVar9];
            uVar1 = p->nCexes;
            uVar2 = *(uint *)((long)pvVar6 + (long)((int)uVar1 >> 5) * 4);
            if ((uVar2 >> (uVar1 & 0x1f) & 1) == 0) {
              __assert_fail("Abc_InfoHasBit(pData, p->nCexes)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsResub.c"
                            ,0x91,"int Abc_NtkMfsTryResubOnce(Mfs_Man_t *, int *, int)");
            }
            *(uint *)((long)pvVar6 + (long)((int)uVar1 >> 5) * 4) =
                 1 << ((byte)uVar1 & 0x1f) ^ uVar2;
            iVar7 = pVVar3->nSize;
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 < iVar7);
      }
      iVar7 = 0;
    }
    else {
      iVar7 = -1;
      lVar8 = 0x314;
    }
    piVar4 = (int *)((long)&p->pPars + lVar8);
    *piVar4 = *piVar4 + 1;
  }
  return iVar7;
}

Assistant:

int Abc_NtkMfsTryResubOnce( Mfs_Man_t * p, int * pCands, int nCands )
{
    int fVeryVerbose = 0;
    unsigned * pData;
    int RetValue, RetValue2 = -1, iVar, i;//, clk = Abc_Clock();
/*
    if ( p->pPars->fGiaSat )
    {
        RetValue2 = Abc_NtkMfsTryResubOnceGia( p, pCands, nCands );
p->timeGia += Abc_Clock() - clk;
        return RetValue2;
    }
*/ 
    p->nSatCalls++;
    RetValue = sat_solver_solve( p->pSat, pCands, pCands + nCands, (ABC_INT64_T)p->pPars->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
//    assert( RetValue == l_False || RetValue == l_True );

    if ( RetValue != l_Undef && RetValue2 != -1 )
    {
        assert( (RetValue == l_False) == (RetValue2 == 1) );
    }

    if ( RetValue == l_False )
    {
        if ( fVeryVerbose )
        printf( "U " );
        return 1;
    }
    if ( RetValue != l_True )
    {
        if ( fVeryVerbose )
        printf( "T " );
        p->nTimeOuts++;
        return -1;
    }
    if ( fVeryVerbose )
    printf( "S " );
    p->nSatCexes++;
    // store the counter-example
    Vec_IntForEachEntry( p->vProjVarsSat, iVar, i )
    {
        pData = (unsigned *)Vec_PtrEntry( p->vDivCexes, i );
        if ( !sat_solver_var_value( p->pSat, iVar ) ) // remove 0s!!!
        {
            assert( Abc_InfoHasBit(pData, p->nCexes) );
            Abc_InfoXorBit( pData, p->nCexes );
        }
    }
    p->nCexes++;
    return 0;

}